

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  uint factor;
  result_type_conflict1 rVar1;
  vector<int,_std::allocator<int>_> *__x;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  bool bVar5;
  vector<int,_std::allocator<int>_> ngramsmod;
  uniform_int_distribution<int> uniform;
  _Vector_base<int,_std::allocator<int>_> local_50;
  uniform_int_distribution<int> local_38;
  
  local_38._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_38._M_param._M_a = 1;
  for (uVar4 = 0;
      uVar4 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2); uVar4 = uVar4 + 1) {
    rVar1 = std::uniform_int_distribution<int>::operator()(&local_38,&state->rng);
    __x = Dictionary::getSubwords
                    ((this->dict_).
                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                     (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start[uVar4]);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_50,__x);
    factor = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             factor;
    if (local_50._M_impl.super__Vector_impl_data._M_finish !=
        local_50._M_impl.super__Vector_impl_data._M_start) {
      uVar2 = ~((int)factor >> 0x1f) & factor;
      while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
        std::vector<int,_std::allocator<int>_>::insert
                  ((vector<int,_std::allocator<int>_> *)&local_50,
                   (const_iterator)local_50._M_impl.super__Vector_impl_data._M_finish,
                   local_50._M_impl.super__Vector_impl_data._M_start);
      }
    }
    for (iVar3 = -rVar1; iVar3 <= rVar1; iVar3 = iVar3 + 1) {
      if (((iVar3 != 0) && (uVar2 = (int)uVar4 + iVar3, -1 < (int)uVar2)) &&
         ((ulong)uVar2 <
          (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start >> 2))) {
        Model::update((this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(vector<int,_std::allocator<int>_> *)&local_50,line,uVar2,lr,state,
                      factor);
      }
    }
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_50);
  }
  return;
}

Assistant:

void FastText::skipgram(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w]);
    std::vector<int32_t> ngramsmod = ngrams;
    int factor = args_->factor;
    if (ngramsmod.size() > 0) {
        for (int i=0; i<factor; i++) ngramsmod.insert(ngramsmod.end(),ngramsmod[0]); //mod avg-pool to weighted-avg-pool
    }
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
          model_->update(ngramsmod, line, w + c, lr, state, factor);
      }
    }
  }
}